

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  MyClass *r;
  SimpleCommand<MyClass> *this;
  
  r = (MyClass *)operator_new(1);
  this = (SimpleCommand<MyClass> *)operator_new(0x20);
  SimpleCommand<MyClass>::SimpleCommand(this,r,(Action)MyClass::Action);
  (**(code **)(*(long *)this + 0x10))(this);
  return 0;
}

Assistant:

int main()
{
    MyClass* receiver = new MyClass;

    // ...

    Command* aCommand =
        new SimpleCommand<MyClass>(receiver, &MyClass::Action);

    // ...

    aCommand->Execute();
}